

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

CLOSE_HANDLE close_clone(CLOSE_HANDLE value)

{
  AMQP_VALUE pAVar1;
  CLOSE_HANDLE local_18;
  CLOSE_INSTANCE *close_instance;
  CLOSE_HANDLE value_local;
  
  local_18 = (CLOSE_HANDLE)malloc(8);
  if (local_18 != (CLOSE_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    local_18->composite_value = pAVar1;
    if (local_18->composite_value == (AMQP_VALUE)0x0) {
      free(local_18);
      local_18 = (CLOSE_HANDLE)0x0;
    }
  }
  return local_18;
}

Assistant:

CLOSE_HANDLE close_clone(CLOSE_HANDLE value)
{
    CLOSE_INSTANCE* close_instance = (CLOSE_INSTANCE*)malloc(sizeof(CLOSE_INSTANCE));
    if (close_instance != NULL)
    {
        close_instance->composite_value = amqpvalue_clone(((CLOSE_INSTANCE*)value)->composite_value);
        if (close_instance->composite_value == NULL)
        {
            free(close_instance);
            close_instance = NULL;
        }
    }

    return close_instance;
}